

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipclisten.c
# Opt level: O3

int ipc_listener_listen(void *arg)

{
  nni_sockaddr *na;
  nni_mtx *mtx;
  int iVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  int *piVar5;
  char *__name;
  socklen_t __len;
  undefined1 local_c0 [8];
  sockaddr_storage ss;
  socklen_t local_34 [2];
  socklen_t len;
  
  na = (nni_sockaddr *)((long)arg + 0x88);
  sVar4 = nni_posix_nn2sockaddr(local_c0,na);
  __len = (socklen_t)sVar4;
  if ((sVar4 & 0xfffffffe) == 0) {
    return 0xf;
  }
  mtx = (nni_mtx *)((long)arg + 0x140);
  local_34[0] = __len;
  nni_mtx_lock(mtx);
  if (*(char *)((long)arg + 0x128) == '\x01') {
    nni_mtx_unlock(mtx);
    return 0xb;
  }
  if (*(char *)((long)arg + 0x129) == '\x01') {
    nni_mtx_unlock(mtx);
    return 7;
  }
  if (na->s_family == 5) {
    ss.__ss_align = 0;
  }
  else {
    if (na->s_family != 2) {
      nni_mtx_unlock(mtx);
      return 0xf;
    }
    ss.__ss_align = (unsigned_long)nni_strdup((char *)((long)arg + 0x8a));
    if ((char *)ss.__ss_align == (char *)0x0) {
      nni_mtx_unlock(mtx);
      return 2;
    }
  }
  iVar1 = socket(1,0x80001,0);
  if (iVar1 < 0) {
    piVar5 = __errno_location();
    iVar2 = nni_plat_errno(*piVar5);
    nni_mtx_unlock(mtx);
    __name = (char *)ss.__ss_align;
LAB_0013109d:
    nni_strfree(__name);
  }
  else {
    iVar2 = bind(iVar1,(sockaddr *)local_c0,__len);
    if (iVar2 == 0) {
LAB_00131030:
      __name = (char *)ss.__ss_align;
      if ((((ss.__ss_align != 0) && (*(uint *)((long)arg + 0x138) != 0)) &&
          (iVar2 = chmod((char *)ss.__ss_align,*(uint *)((long)arg + 0x138) & 0xffff0fff),
          iVar2 != 0)) || (iVar2 = listen(iVar1,0x80), iVar2 != 0)) goto LAB_00131067;
    }
    else {
      if (na->s_family == 2) {
        piVar5 = __errno_location();
        if ((*piVar5 == 0x62) || (*piVar5 == 0x11)) {
          ipc_remove_stale((char *)ss.__ss_align);
          iVar2 = bind(iVar1,(sockaddr *)local_c0,__len);
          if (iVar2 == 0) goto LAB_00131030;
        }
      }
      nni_strfree((char *)ss.__ss_align);
      __name = (char *)0x0;
LAB_00131067:
      piVar5 = __errno_location();
      iVar2 = nni_plat_errno(*piVar5);
      if (iVar2 != 0) {
        nni_mtx_unlock(mtx);
        close(iVar1);
        if (__name != (char *)0x0) {
          unlink(__name);
        }
        goto LAB_0013109d;
      }
    }
    nni_posix_pfd_init((nni_posix_pfd *)((long)arg + 0x50),iVar1,ipc_listener_cb,arg);
    if ((*(short *)((long)arg + 0x88) == 5) && (*(short *)((long)arg + 0x8a) == 0)) {
      local_34[0] = 0x80;
      iVar1 = getsockname(iVar1,(sockaddr *)local_c0,local_34);
      if ((iVar1 == 0) && ((uVar3 = local_34[0] - 3, uVar3 < 0x69 && (local_c0[2] == '\0')))) {
        *(short *)((long)arg + 0x8a) = (short)uVar3;
        local_34[0] = uVar3;
        memcpy((void *)((long)arg + 0x8c),local_c0 + 3,(ulong)uVar3);
      }
    }
    *(undefined1 *)((long)arg + 0x128) = 1;
    *(char **)((long)arg + 0x130) = __name;
    nni_mtx_unlock(mtx);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
ipc_listener_listen(void *arg)
{
	ipc_listener           *l = arg;
	socklen_t               len;
	struct sockaddr_storage ss;
	int                     rv;
	int                     fd;
	char                   *path;

	if ((len = nni_posix_nn2sockaddr(&ss, &l->sa)) < sizeof(sa_family_t)) {
		return (NNG_EADDRINVAL);
	}

	nni_mtx_lock(&l->mtx);
	if (l->started) {
		nni_mtx_unlock(&l->mtx);
		return (NNG_ESTATE);
	}
	if (l->closed) {
		nni_mtx_unlock(&l->mtx);
		return (NNG_ECLOSED);
	}

	switch (l->sa.s_family) {
	case NNG_AF_IPC:
		if ((path = nni_strdup(l->sa.s_ipc.sa_path)) == NULL) {
			nni_mtx_unlock(&l->mtx);
			return (NNG_ENOMEM);
		}
		break;
	case NNG_AF_ABSTRACT:
		path = NULL;
		break;
	default:
		nni_mtx_unlock(&l->mtx);
		return (NNG_EADDRINVAL);
	}

	if ((fd = socket(AF_UNIX, SOCK_STREAM | SOCK_CLOEXEC, 0)) < 0) {
		rv = nni_plat_errno(errno);
		nni_mtx_unlock(&l->mtx);
		nni_strfree(path);
		return (rv);
	}

	if ((rv = bind(fd, (struct sockaddr *) &ss, len)) != 0) {
		if ((l->sa.s_family == NNG_AF_IPC) &&
		    ((errno == EEXIST) || (errno == EADDRINUSE))) {
			ipc_remove_stale(path);
			rv = bind(fd, (struct sockaddr *) &ss, len);
		}
		if (rv != 0) {
			nni_strfree(path);
			path = NULL;
		}
	}

	if ((rv != 0) || (ipc_listener_chmod(l, path) != 0) ||
	    (listen(fd, 128) != 0)) {
		rv = nni_plat_errno(errno);
	}
	if (rv != 0) {
		nni_mtx_unlock(&l->mtx);
		(void) close(fd);
		if (path != NULL) {
			unlink(path);
		}
		nni_strfree(path);
		return (rv);
	}

	nni_posix_pfd_init(&l->pfd, fd, ipc_listener_cb, l);

#ifdef NNG_HAVE_ABSTRACT_SOCKETS
	// If the original address was for a system assigned value,
	// then figure out what we got.  This is analogous to TCP
	// binding to port 0.
	if ((l->sa.s_family == NNG_AF_ABSTRACT) &&
	    (l->sa.s_abstract.sa_len == 0)) {
		struct sockaddr_un *su = (void *) &ss;
		len                    = sizeof(ss);
		if ((getsockname(fd, (struct sockaddr *) &ss, &len) == 0) &&
		    (len > sizeof(sa_family_t)) &&
		    (len <= sizeof(l->sa.s_abstract.sa_name)) &&
		    (su->sun_path[0] == '\0')) {
			len -= sizeof(sa_family_t);
			len--; // don't count the leading NUL.
			l->sa.s_abstract.sa_len = len;
			memcpy(
			    l->sa.s_abstract.sa_name, &su->sun_path[1], len);
		}
	}
#endif

	l->started = true;
	l->path    = path;
	nni_mtx_unlock(&l->mtx);

	return (0);
}